

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,cmListFileBacktrace *bt)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  cmSourceFile *this_00;
  pointer pbVar4;
  string base;
  string force;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if (((char)iVar2 != '\0') && (bVar1 = HasUniqueByproducts(this,byproducts,bt), bVar1)) {
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    local_b0.View_._M_str = (psVar3->_M_dataplus)._M_p;
    local_b0.View_._M_len = psVar3->_M_string_length;
    local_80.View_._M_len = 0xc;
    local_80.View_._M_str = "/CMakeFiles/";
    local_50._M_dataplus._M_p._0_1_ = 0x2d;
    cmStrCat<std::__cxx11::string,char>(&local_e8,&local_b0,&local_80,targetName,(char *)&local_50);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_c8,(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
               IncludeEmptyConfig);
    for (pbVar4 = local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      local_b0.View_._M_len = local_e8._M_string_length;
      local_b0.View_._M_str = local_e8._M_dataplus._M_p;
      local_80.View_._M_str = (pbVar4->_M_dataplus)._M_p;
      local_80.View_._M_len = pbVar4->_M_string_length;
      cmStrCat<>(&local_50,&local_b0,&local_80);
      this_00 = cmMakefile::GetOrCreateGeneratedSource
                          ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                           &local_50);
      if (this_00 == (cmSourceFile *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"Could not get source file entry for ",&local_50);
        cmSystemTools::Error((string *)&local_b0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"SYMBOLIC",(allocator<char> *)&local_80);
        cmSourceFile::SetProperty(this_00,(string *)&local_b0,"1");
      }
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                   TargetSearchIndex,targetName);
    local_b0.View_._M_len = local_e8._M_string_length;
    local_b0.View_._M_str = local_e8._M_dataplus._M_p;
    local_80.View_._M_len = 9;
    local_80.View_._M_str = "$<CONFIG>";
    cmStrCat<>(__return_storage_ptr__,&local_b0,&local_80);
    std::__cxx11::string::~string((string *)&local_e8);
    return __return_storage_ptr__;
  }
  cmLocalGenerator::CreateUtilityOutput
            (__return_storage_ptr__,(cmLocalGenerator *)this,targetName,byproducts,bt);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const& byproducts,
  cmListFileBacktrace const& bt)
{
  // In Ninja Multi-Config, we can only produce cross-config utility
  // commands if all byproducts are per-config.
  if (!this->GetGlobalGenerator()->IsMultiConfig() ||
      !this->HasUniqueByproducts(byproducts, bt)) {
    return this->cmLocalGenerator::CreateUtilityOutput(targetName, byproducts,
                                                       bt);
  }

  std::string const base = cmStrCat(this->GetCurrentBinaryDirectory(),
                                    "/CMakeFiles/", targetName, '-');
  // The output is not actually created so mark it symbolic.
  for (std::string const& config :
       this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig)) {
    std::string const force = cmStrCat(base, config);
    if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for " + force);
    }
  }
  this->GetGlobalNinjaGenerator()->AddPerConfigUtilityTarget(targetName);
  return cmStrCat(base, "$<CONFIG>"_s);
}